

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O1

ExpEmit __thiscall FxRandom::Emit(FxRandom *this,VMFunctionBuilder *build)

{
  FScriptPosition *pos;
  _func_int **ptr;
  PClass *pPVar1;
  byte bVar2;
  int iVar3;
  int opa;
  PSymbol *pPVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  uint uVar6;
  byte bVar7;
  bool bVar8;
  FName local_2c;
  
  local_2c.Index = 0x21f;
  pPVar4 = FindDecorateBuiltinFunction(&local_2c,DecoRandom);
  pPVar1 = PSymbolVMFunction::RegistrationInfo.MyClass;
  if ((pPVar4->super_DObject).Class == (PClass *)0x0) {
    iVar3 = (**(pPVar4->super_DObject)._vptr_DObject)(pPVar4);
    (pPVar4->super_DObject).Class = (PClass *)CONCAT44(extraout_var,iVar3);
  }
  pPVar5 = (pPVar4->super_DObject).Class;
  bVar8 = pPVar5 != (PClass *)0x0;
  if (pPVar5 != pPVar1 && bVar8) {
    do {
      pPVar5 = pPVar5->ParentClass;
      bVar8 = pPVar5 != (PClass *)0x0;
      if (pPVar5 == pPVar1) break;
    } while (pPVar5 != (PClass *)0x0);
  }
  if (!bVar8) {
    __assert_fail("sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0xafd,"virtual ExpEmit FxRandom::Emit(VMFunctionBuilder *)");
  }
  ptr = pPVar4[1].super_DObject._vptr_DObject;
  if (ptr != (_func_int **)0x0) {
    bVar2 = (this->super_FxExpression).field_0x31;
    iVar3 = VMFunctionBuilder::GetConstantAddress(build,this->rng,'\t');
    VMFunctionBuilder::Emit(build,0x39,0,7,iVar3);
    iVar3 = 1;
    if ((this->min != (FxExpression *)0x0) && (this->max != (FxExpression *)0x0)) {
      pos = &(this->super_FxExpression).ScriptPosition;
      EmitParameter(build,this->min,pos);
      EmitParameter(build,this->max,pos);
      iVar3 = 3;
    }
    opa = VMFunctionBuilder::GetConstantAddress(build,ptr,'\x01');
    VMFunctionBuilder::Emit(build,(uint)bVar2 * 2 + 0x3c,opa,iVar3,1);
    if ((this->super_FxExpression).field_0x31 == '\0') {
      uVar6 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
      bVar7 = 0;
      VMFunctionBuilder::Emit(build,0x3f,0,0,uVar6 & 0xff);
      bVar2 = 0;
    }
    else {
      bVar2 = 0xff;
      bVar7 = 4;
      uVar6 = 0;
    }
    return (ExpEmit)((uint3)uVar6 & 0xff | (uint3)bVar2 << 8 | (uint3)bVar7 << 0x10);
  }
  __assert_fail("((PSymbolVMFunction *)sym)->Function != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                ,0xafe,"virtual ExpEmit FxRandom::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxRandom::Emit(VMFunctionBuilder *build)
{
	// Call DecoRandom to generate a random number.
	VMFunction *callfunc;
	PSymbol *sym = FindDecorateBuiltinFunction(NAME_DecoRandom, DecoRandom);

	assert(sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction)));
	assert(((PSymbolVMFunction *)sym)->Function != NULL);
	callfunc = ((PSymbolVMFunction *)sym)->Function;

	int opcode = (EmitTail ? OP_TAIL_K : OP_CALL_K);

	build->Emit(OP_PARAM, 0, REGT_POINTER | REGT_KONST, build->GetConstantAddress(rng, ATAG_RNG));
	if (min != NULL && max != NULL)
	{
		EmitParameter(build, min, ScriptPosition);
		EmitParameter(build, max, ScriptPosition);
		build->Emit(opcode, build->GetConstantAddress(callfunc, ATAG_OBJECT), 3, 1);
	}
	else
	{
		build->Emit(opcode, build->GetConstantAddress(callfunc, ATAG_OBJECT), 1, 1);
	}

	if (EmitTail)
	{
		ExpEmit call;
		call.Final = true;
		return call;
	}

	ExpEmit out(build, REGT_INT);
	build->Emit(OP_RESULT, 0, REGT_INT, out.RegNum);
	return out;
}